

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::append(QByteArray *this,char ch)

{
  char *pcVar1;
  parameter_type in_SIL;
  QArrayDataPointer<char> *in_RDI;
  QPodArrayOps<char> *unaff_retaddr;
  undefined3 in_stack_0000000c;
  undefined7 in_stack_fffffffffffffff0;
  QArrayDataPointer<char> *n;
  
  n = in_RDI;
  QArrayDataPointer<char>::detachAndGrow
            (&this->d,_in_stack_0000000c,(qsizetype)unaff_retaddr,(char **)in_RDI,
             (QArrayDataPointer<char> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  QArrayDataPointer<char>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<char>::copyAppend(unaff_retaddr,(qsizetype)n,in_SIL);
  pcVar1 = QArrayDataPointer<char>::data(in_RDI);
  pcVar1[in_RDI->size] = '\0';
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray& QByteArray::append(char ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch);
    d.data()[d.size] = '\0';
    return *this;
}